

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::GetElementIIntIndex
              (Var instance,Var index,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint32 uVar5;
  PropertyQueryFlags PVar6;
  int32 iVar7;
  int iVar8;
  Var in_RAX;
  undefined4 *puVar9;
  Var pvVar10;
  RecyclableObject *this;
  JavascriptArray *arr;
  JavascriptString *this_00;
  TypedArray<double,_false,_true> *this_01;
  TypedArray<int,_false,_true> *this_02;
  TypedArray<short,_false,_true> *this_03;
  TypedArray<unsigned_char,_false,_true> *this_04;
  TypedArray<char,_false,_true> *this_05;
  JavascriptNativeFloatArray *arr_00;
  TypedArray<float,_false,_true> *this_06;
  JavascriptNativeIntArray *arr_01;
  TypedArray<unsigned_char,_true,_true> *this_07;
  TypedArray<unsigned_short,_false,_true> *this_08;
  TypedArray<unsigned_int,_false,_true> *this_09;
  TypedArray<double,_false,_false> *this_10;
  TypedArray<int,_false,_false> *this_11;
  TypedArray<short,_false,_false> *this_12;
  TypedArray<unsigned_char,_false,_false> *this_13;
  TypedArray<char,_false,_false> *this_14;
  TypedArray<float,_false,_false> *this_15;
  TypedArray<unsigned_char,_true,_false> *this_16;
  TypedArray<unsigned_short,_false,_false> *this_17;
  TypedArray<unsigned_int,_false,_false> *this_18;
  Var local_38;
  Var result;
  
  local_38 = in_RAX;
  bVar3 = TaggedInt::Is(index);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xe76,"(TaggedInt::Is(index))","TaggedInt::Is(index)");
    if (!bVar3) goto LAB_0099d2db;
    *puVar9 = 0;
  }
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_0099d2db;
    *puVar9 = 0;
  }
  bVar3 = TaggedInt::Is(instance);
  if ((ulong)instance >> 0x32 != 0 || bVar3) goto switchD_0099cd7b_caseD_1f;
  this = UnsafeVarTo<Js::RecyclableObject>(instance);
  if (this == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_0099d2db;
    *puVar9 = 0;
  }
  TVar1 = ((this->type).ptr)->typeId;
  if ((0x57 < (int)TVar1) && (BVar4 = RecyclableObject::IsExternal(this), BVar4 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar3) {
LAB_0099d2db:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
  }
  switch(TVar1) {
  case TypeIds_Array:
    arr = UnsafeVarTo<Js::JavascriptArray>(instance);
    iVar7 = TaggedInt::ToInt32(index);
    iVar8 = OP_GetElementI_ArrayFastPath<Js::JavascriptArray>(arr,iVar7,&local_38,scriptContext);
    goto LAB_0099cfe8;
  case TypeIds_NativeIntArray:
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(instance);
    arr_01 = UnsafeVarTo<Js::JavascriptNativeIntArray>(instance);
    iVar7 = TaggedInt::ToInt32(index);
    iVar8 = OP_GetElementI_ArrayFastPath<Js::JavascriptNativeIntArray>
                      (arr_01,iVar7,&local_38,scriptContext);
    goto LAB_0099cfe8;
  case TypeIds_CopyOnAccessNativeIntArray:
  case TypeIds_ArrayLastWithES5:
  case TypeIds_Date:
  case TypeIds_RegEx:
  case TypeIds_Error:
  case TypeIds_BooleanObject:
  case TypeIds_NumberObject:
  case TypeIds_StringObject:
  case TypeIds_BigIntObject:
  case TypeIds_SIMDObject:
  case TypeIds_Arguments:
  case TypeIds_ArrayBuffer:
    break;
  case TypeIds_ArrayLast:
    arr_00 = UnsafeVarTo<Js::JavascriptNativeFloatArray>(instance);
    iVar7 = TaggedInt::ToInt32(index);
    iVar8 = OP_GetElementI_ArrayFastPath<Js::JavascriptNativeFloatArray>
                      (arr_00,iVar7,&local_38,scriptContext);
LAB_0099cfe8:
    if (iVar8 != 0) {
      return local_38;
    }
    break;
  case TypeIds_Int8Array:
    uVar5 = TaggedInt::ToInt32(index);
    if (*instance == VirtualTableInfo<Js::TypedArray<char,_false,_true>_>::Address) {
      this_05 = UnsafeVarTo<Js::TypedArray<char,false,true>>(instance);
      if (-1 < (int)uVar5) {
        pvVar10 = TypedArray<char,_false,_true>::DirectGetItem(this_05,uVar5);
        return pvVar10;
      }
    }
    else if ((*instance == VirtualTableInfo<Js::TypedArray<char,_false,_false>_>::Address) &&
            (this_14 = UnsafeVarTo<Js::TypedArray<char,false,false>>(instance), -1 < (int)uVar5)) {
      pvVar10 = TypedArray<char,_false,_false>::DirectGetItem(this_14,uVar5);
      return pvVar10;
    }
    break;
  case TypeIds_Uint8Array:
    uVar5 = TaggedInt::ToInt32(index);
    if (*instance == VirtualTableInfo<Js::TypedArray<unsigned_char,_false,_true>_>::Address) {
      this_04 = UnsafeVarTo<Js::TypedArray<unsigned_char,false,true>>(instance);
      if (-1 < (int)uVar5) {
        pvVar10 = TypedArray<unsigned_char,_false,_true>::DirectGetItem(this_04,uVar5);
        return pvVar10;
      }
    }
    else if ((*instance == VirtualTableInfo<Js::TypedArray<unsigned_char,_false,_false>_>::Address)
            && (this_13 = UnsafeVarTo<Js::TypedArray<unsigned_char,false,false>>(instance),
               -1 < (int)uVar5)) {
      pvVar10 = TypedArray<unsigned_char,_false,_false>::DirectGetItem(this_13,uVar5);
      return pvVar10;
    }
    break;
  case TypeIds_Uint8ClampedArray:
    uVar5 = TaggedInt::ToInt32(index);
    if (*instance == VirtualTableInfo<Js::TypedArray<unsigned_char,_true,_true>_>::Address) {
      this_07 = UnsafeVarTo<Js::TypedArray<unsigned_char,true,true>>(instance);
      if (-1 < (int)uVar5) {
        pvVar10 = TypedArray<unsigned_char,_true,_true>::DirectGetItem(this_07,uVar5);
        return pvVar10;
      }
    }
    else if ((*instance == VirtualTableInfo<Js::TypedArray<unsigned_char,_true,_false>_>::Address)
            && (this_16 = UnsafeVarTo<Js::TypedArray<unsigned_char,true,false>>(instance),
               -1 < (int)uVar5)) {
      pvVar10 = TypedArray<unsigned_char,_true,_false>::DirectGetItem(this_16,uVar5);
      return pvVar10;
    }
    break;
  case TypeIds_Int16Array:
    uVar5 = TaggedInt::ToInt32(index);
    if (*instance == VirtualTableInfo<Js::TypedArray<short,_false,_true>_>::Address) {
      this_03 = UnsafeVarTo<Js::TypedArray<short,false,true>>(instance);
      if (-1 < (int)uVar5) {
        pvVar10 = TypedArray<short,_false,_true>::DirectGetItem(this_03,uVar5);
        return pvVar10;
      }
    }
    else if ((*instance == VirtualTableInfo<Js::TypedArray<short,_false,_false>_>::Address) &&
            (this_12 = UnsafeVarTo<Js::TypedArray<short,false,false>>(instance), -1 < (int)uVar5)) {
      pvVar10 = TypedArray<short,_false,_false>::DirectGetItem(this_12,uVar5);
      return pvVar10;
    }
    break;
  case TypeIds_Uint16Array:
    uVar5 = TaggedInt::ToInt32(index);
    if (*instance == VirtualTableInfo<Js::TypedArray<unsigned_short,_false,_true>_>::Address) {
      this_08 = UnsafeVarTo<Js::TypedArray<unsigned_short,false,true>>(instance);
      if (-1 < (int)uVar5) {
        pvVar10 = TypedArray<unsigned_short,_false,_true>::DirectGetItem(this_08,uVar5);
        return pvVar10;
      }
    }
    else if ((*instance == VirtualTableInfo<Js::TypedArray<unsigned_short,_false,_false>_>::Address)
            && (this_17 = UnsafeVarTo<Js::TypedArray<unsigned_short,false,false>>(instance),
               -1 < (int)uVar5)) {
      pvVar10 = TypedArray<unsigned_short,_false,_false>::DirectGetItem(this_17,uVar5);
      return pvVar10;
    }
    break;
  case TypeIds_Int32Array:
    uVar5 = TaggedInt::ToInt32(index);
    if (*instance == VirtualTableInfo<Js::TypedArray<int,_false,_true>_>::Address) {
      this_02 = UnsafeVarTo<Js::TypedArray<int,false,true>>(instance);
      if (-1 < (int)uVar5) {
        pvVar10 = TypedArray<int,_false,_true>::DirectGetItem(this_02,uVar5);
        return pvVar10;
      }
    }
    else if ((*instance == VirtualTableInfo<Js::TypedArray<int,_false,_false>_>::Address) &&
            (this_11 = UnsafeVarTo<Js::TypedArray<int,false,false>>(instance), -1 < (int)uVar5)) {
      pvVar10 = TypedArray<int,_false,_false>::DirectGetItem(this_11,uVar5);
      return pvVar10;
    }
    break;
  case TypeIds_Uint32Array:
    uVar5 = TaggedInt::ToInt32(index);
    if (*instance == VirtualTableInfo<Js::TypedArray<unsigned_int,_false,_true>_>::Address) {
      this_09 = UnsafeVarTo<Js::TypedArray<unsigned_int,false,true>>(instance);
      if (-1 < (int)uVar5) {
        pvVar10 = TypedArray<unsigned_int,_false,_true>::DirectGetItem(this_09,uVar5);
        return pvVar10;
      }
    }
    else if ((*instance == VirtualTableInfo<Js::TypedArray<unsigned_int,_false,_false>_>::Address)
            && (this_18 = UnsafeVarTo<Js::TypedArray<unsigned_int,false,false>>(instance),
               -1 < (int)uVar5)) {
      pvVar10 = TypedArray<unsigned_int,_false,_false>::DirectGetItem(this_18,uVar5);
      return pvVar10;
    }
    break;
  case TypeIds_Float32Array:
    uVar5 = TaggedInt::ToInt32(index);
    if (*instance == VirtualTableInfo<Js::TypedArray<float,_false,_true>_>::Address) {
      this_06 = UnsafeVarTo<Js::TypedArray<float,false,true>>(instance);
      if (-1 < (int)uVar5) {
        pvVar10 = TypedArray<float,_false,_true>::DirectGetItem(this_06,uVar5);
        return pvVar10;
      }
    }
    else if ((*instance == VirtualTableInfo<Js::TypedArray<float,_false,_false>_>::Address) &&
            (this_15 = UnsafeVarTo<Js::TypedArray<float,false,false>>(instance), -1 < (int)uVar5)) {
      pvVar10 = TypedArray<float,_false,_false>::DirectGetItem(this_15,uVar5);
      return pvVar10;
    }
    break;
  case TypeIds_Float64Array:
    uVar5 = TaggedInt::ToInt32(index);
    if (*instance == VirtualTableInfo<Js::TypedArray<double,_false,_true>_>::Address) {
      this_01 = UnsafeVarTo<Js::TypedArray<double,false,true>>(instance);
      if (-1 < (int)uVar5) {
        pvVar10 = TypedArray<double,_false,_true>::DirectGetItem(this_01,uVar5);
        return pvVar10;
      }
    }
    else if ((*instance == VirtualTableInfo<Js::TypedArray<double,_false,_false>_>::Address) &&
            (this_10 = UnsafeVarTo<Js::TypedArray<double,false,false>>(instance), -1 < (int)uVar5))
    {
      pvVar10 = TypedArray<double,_false,_false>::DirectGetItem(this_10,uVar5);
      return pvVar10;
    }
    break;
  default:
    if (TVar1 == TypeIds_String) {
      uVar5 = TaggedInt::ToUInt32(index);
      this_00 = UnsafeVarTo<Js::JavascriptString>(instance);
      PVar6 = JavascriptString::GetItemQuery(this_00,instance,uVar5,&local_38,scriptContext);
      if (PVar6 == Property_Found) {
        return local_38;
      }
    }
  }
switchD_0099cd7b_caseD_1f:
  pvVar10 = GetElementIHelper(instance,index,instance,scriptContext);
  return pvVar10;
}

Assistant:

Var JavascriptOperators::GetElementIIntIndex(_In_ Var instance, _In_ Var index, _In_ ScriptContext* scriptContext)
    {
        Assert(TaggedInt::Is(index));

        switch (JavascriptOperators::GetTypeId(instance))
        {
        case TypeIds_Array: //fast path for array
        {
            Var result;
            if (OP_GetElementI_ArrayFastPath(UnsafeVarTo<JavascriptArray>(instance), TaggedInt::ToInt32(index), &result, scriptContext))
            {
                return result;
            }
            break;
        }
        case TypeIds_NativeIntArray:
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
            Var result;
            if (OP_GetElementI_ArrayFastPath(UnsafeVarTo<JavascriptNativeIntArray>(instance), TaggedInt::ToInt32(index), &result, scriptContext))
            {
                return result;
            }
            break;
        }
        case TypeIds_NativeFloatArray:
        {
            Var result;
            if (OP_GetElementI_ArrayFastPath(UnsafeVarTo<JavascriptNativeFloatArray>(instance), TaggedInt::ToInt32(index), &result, scriptContext))
            {
                return result;
            }
            break;
        }

        case TypeIds_String: // fast path for string
        {
            charcount_t indexInt = TaggedInt::ToUInt32(index);
            JavascriptString* string = UnsafeVarTo<JavascriptString>(instance);
            Var result;
            if (JavascriptConversion::PropertyQueryFlagsToBoolean(string->JavascriptString::GetItemQuery(instance, indexInt, &result, scriptContext)))
            {
                return result;
            }
            break;
        }

        case TypeIds_Int8Array:
        {
            // The typed array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Int8VirtualArray>::HasVirtualTable(instance))
            {
                Int8VirtualArray* int8Array = UnsafeVarTo<Int8VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return int8Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Int8Array>::HasVirtualTable(instance))
            {
                Int8Array* int8Array = UnsafeVarTo<Int8Array>(instance);
                if (indexInt >= 0)
                {
                    return int8Array->DirectGetItem(indexInt);
                }
            }
            break;
        }

        case TypeIds_Uint8Array:
        {
            // The typed array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Uint8VirtualArray>::HasVirtualTable(instance))
            {
                Uint8VirtualArray* uint8Array = UnsafeVarTo<Uint8VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return uint8Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Uint8Array>::HasVirtualTable(instance))
            {
                Uint8Array* uint8Array = UnsafeVarTo<Uint8Array>(instance);
                if (indexInt >= 0)
                {
                    return uint8Array->DirectGetItem(indexInt);
                }
            }
            break;
        }

        case TypeIds_Uint8ClampedArray:
        {
            // The typed array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Uint8ClampedVirtualArray>::HasVirtualTable(instance))
            {
                Uint8ClampedVirtualArray* uint8ClampedArray = UnsafeVarTo<Uint8ClampedVirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return uint8ClampedArray->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Uint8ClampedArray>::HasVirtualTable(instance))
            {
                Uint8ClampedArray* uint8ClampedArray = UnsafeVarTo<Uint8ClampedArray>(instance);
                if (indexInt >= 0)
                {
                    return uint8ClampedArray->DirectGetItem(indexInt);
                }
            }
            break;
        }

        case TypeIds_Int16Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);

            if (VirtualTableInfo<Int16VirtualArray>::HasVirtualTable(instance))
            {
                Int16VirtualArray* int16Array = UnsafeVarTo<Int16VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return int16Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Int16Array>::HasVirtualTable(instance))
            {
                Int16Array* int16Array = UnsafeVarTo<Int16Array>(instance);
                if (indexInt >= 0)
                {
                    return int16Array->DirectGetItem(indexInt);
                }
            }
            break;
        }

        case TypeIds_Uint16Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);

            if (VirtualTableInfo<Uint16VirtualArray>::HasVirtualTable(instance))
            {
                Uint16VirtualArray* uint16Array = UnsafeVarTo<Uint16VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return uint16Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Uint16Array>::HasVirtualTable(instance))
            {
                Uint16Array* uint16Array = UnsafeVarTo<Uint16Array>(instance);
                if (indexInt >= 0)
                {
                    return uint16Array->DirectGetItem(indexInt);
                }
            }
            break;
        }
        case TypeIds_Int32Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Int32VirtualArray>::HasVirtualTable(instance))
            {
                Int32VirtualArray* int32Array = UnsafeVarTo<Int32VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return int32Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Int32Array>::HasVirtualTable(instance))
            {
                Int32Array* int32Array = UnsafeVarTo<Int32Array>(instance);
                if (indexInt >= 0)
                {
                    return int32Array->DirectGetItem(indexInt);
                }
            }
            break;

        }
        case TypeIds_Uint32Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Uint32VirtualArray>::HasVirtualTable(instance))
            {
                Uint32VirtualArray* uint32Array = UnsafeVarTo<Uint32VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return uint32Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Uint32Array>::HasVirtualTable(instance))
            {
                Uint32Array* uint32Array = UnsafeVarTo<Uint32Array>(instance);
                if (indexInt >= 0)
                {
                    return uint32Array->DirectGetItem(indexInt);
                }
            }
            break;
        }
        case TypeIds_Float32Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);

            if (VirtualTableInfo<Float32VirtualArray>::HasVirtualTable(instance))
            {
                Float32VirtualArray* float32Array = UnsafeVarTo<Float32VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return float32Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Float32Array>::HasVirtualTable(instance))
            {
                Float32Array* float32Array = UnsafeVarTo<Float32Array>(instance);
                if (indexInt >= 0)
                {
                    return float32Array->DirectGetItem(indexInt);
                }
            }
            break;
        }
        case TypeIds_Float64Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Float64VirtualArray>::HasVirtualTable(instance))
            {
                Float64VirtualArray* float64Array = UnsafeVarTo<Float64VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return float64Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Float64Array>::HasVirtualTable(instance))
            {
                Float64Array* float64Array = UnsafeVarTo<Float64Array>(instance);
                if (indexInt >= 0)
                {
                    return float64Array->DirectGetItem(indexInt);
                }
            }
            break;
        }

        default:
            break;
        }
        return JavascriptOperators::GetElementIHelper(instance, index, instance, scriptContext);
    }